

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

bool crnlib::int_to_string(int value,char *pDst,uint len)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  char buf [16];
  
  uVar3 = -value;
  if (0 < value) {
    uVar3 = value;
  }
  buf[0xf] = '\0';
  pbVar6 = (byte *)(buf + 0xe);
  do {
    pbVar5 = pbVar6;
    *pbVar5 = (byte)(uVar3 % 10) | 0x30;
    pbVar6 = pbVar5 + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (value < 0) {
    *pbVar6 = 0x2d;
    pbVar6 = pbVar5 + -2;
  }
  pcVar4 = buf + (0xf - (long)pbVar6);
  if (pcVar4 <= (char *)(ulong)len) {
    for (pcVar2 = (char *)0x0; pcVar4 != pcVar2; pcVar2 = pcVar2 + 1) {
      pDst[(long)pcVar2] = pbVar6[(long)(pcVar2 + 1)];
    }
  }
  return pcVar4 <= (char *)(ulong)len;
}

Assistant:

bool int_to_string(int value, char* pDst, uint len)
    {
        CRNLIB_ASSERT(pDst);

        const uint cBufSize = 16;
        char buf[cBufSize];

        uint j = static_cast<uint>((value < 0) ? -value : value);

        char* p = buf + cBufSize - 1;

        *p-- = '\0';

        do
        {
            *p-- = static_cast<uint8>('0' + (j % 10));
            j /= 10;
        } while (j);

        if (value < 0)
        {
            *p-- = '-';
        }

        const size_t total_bytes = (buf + cBufSize - 1) - p;
        if (total_bytes > len)
        {
            return false;
        }

        for (size_t i = 0; i < total_bytes; i++)
        {
            pDst[i] = p[1 + i];
        }

        return true;
    }